

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex_float.h
# Opt level: O2

uint_type __thiscall
spvtools::utils::
HexFloat<spvtools::utils::FloatProxy<float>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>_>_>
::getNormalizedSignificand
          (HexFloat<spvtools::utils::FloatProxy<float>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>_>_>
           *this)

{
  int_type iVar1;
  uint uVar2;
  int_type i;
  
  iVar1 = getUnbiasedNormalizedExponent(this);
  uVar2 = (this->value_).data_;
  for (; iVar1 < -0x7e; iVar1 = iVar1 + 1) {
    uVar2 = uVar2 * 2;
  }
  return uVar2 & 0x7fffff;
}

Assistant:

const uint_type getNormalizedSignificand() const {
    int_type unbiased_exponent = getUnbiasedNormalizedExponent();
    uint_type significand = getSignificandBits();
    for (int_type i = unbiased_exponent; i <= min_exponent; ++i) {
      significand = static_cast<uint_type>(significand << 1);
    }
    significand &= fraction_encode_mask;
    return significand;
  }